

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

size_t testing::internal::GetThreadCount(void)

{
  int iVar1;
  Message *this;
  size_t sVar2;
  string filename;
  int in_stack_000001dc;
  string *in_stack_000001e0;
  char (*in_stack_ffffffffffffff98) [7];
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Message *in_stack_ffffffffffffffd0;
  string local_20 [32];
  
  Message::Message(in_stack_ffffffffffffffd0);
  Message::operator<<((Message *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
  getpid();
  Message::operator<<((Message *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (int *)in_stack_ffffffffffffff98);
  this = Message::operator<<((Message *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             (char (*) [6])in_stack_ffffffffffffff98);
  Message::GetString_abi_cxx11_(this);
  Message::~Message((Message *)0x1aa5bd);
  iVar1 = anon_unknown_89::ReadProcFileField<int>(in_stack_000001e0,in_stack_000001dc);
  sVar2 = (size_t)iVar1;
  std::__cxx11::string::~string(local_20);
  return sVar2;
}

Assistant:

size_t GetThreadCount() {
  const string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<int>(filename, 19);
}